

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::SubDataToUndefinedCase::SubDataToUndefinedCase
          (SubDataToUndefinedCase *this,Context *context,char *name,char *desc,deUint32 target,
          deUint32 usage,int size,IVec2 *ranges,int numRanges,VerifyType verify)

{
  allocator_type local_31;
  
  deqp::gls::BufferTestUtil::BufferCase::BufferCase
            (&this->super_BufferCase,context->m_testCtx,context->m_renderCtx,name,desc);
  (this->super_BufferCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SubDataToUndefinedCase_0218e728;
  this->m_target = target;
  this->m_usage = usage;
  this->m_size = size;
  std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
  vector<tcu::Vector<int,2>const*,void>
            ((vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&this->m_ranges,ranges
             ,ranges + numRanges,&local_31);
  this->m_verify = verify;
  return;
}

Assistant:

SubDataToUndefinedCase (Context& context, const char* name, const char* desc, deUint32 target, deUint32 usage, int size, const tcu::IVec2* ranges, int numRanges, VerifyType verify)
		: BufferCase	(context.getTestContext(), context.getRenderContext(), name, desc)
		, m_target		(target)
		, m_usage		(usage)
		, m_size		(size)
		, m_ranges		(ranges, ranges+numRanges)
		, m_verify		(verify)
	{
	}